

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

int secp256k1_ge_x_frac_on_curve_var(secp256k1_fe *xn,secp256k1_fe *xd)

{
  int iVar1;
  secp256k1_fe t;
  secp256k1_fe r;
  
  iVar1 = secp256k1_fe_normalizes_to_zero_var(xd);
  if (iVar1 == 0) {
    secp256k1_fe_mul(&r,xd,xn);
    secp256k1_fe_sqr(&t,xn);
    secp256k1_fe_mul(&r,&r,&t);
    secp256k1_fe_sqr(&t,xd);
    secp256k1_fe_sqr(&t,&t);
    secp256k1_fe_mul_int_unchecked(&t,2);
    secp256k1_fe_add(&r,&t);
    iVar1 = secp256k1_fe_is_square_var(&r);
    return iVar1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/secp256k1/src/group_impl.h"
          ,0x3a3,"test condition failed: !secp256k1_fe_normalizes_to_zero_var(xd)");
  abort();
}

Assistant:

static int secp256k1_ge_x_frac_on_curve_var(const secp256k1_fe *xn, const secp256k1_fe *xd) {
    /* We want to determine whether (xn/xd) is on the curve.
     *
     * (xn/xd)^3 + 7 is square <=> xd*xn^3 + 7*xd^4 is square (multiplying by xd^4, a square).
     */
     secp256k1_fe r, t;
     VERIFY_CHECK(!secp256k1_fe_normalizes_to_zero_var(xd));

     secp256k1_fe_mul(&r, xd, xn); /* r = xd*xn */
     secp256k1_fe_sqr(&t, xn); /* t = xn^2 */
     secp256k1_fe_mul(&r, &r, &t); /* r = xd*xn^3 */
     secp256k1_fe_sqr(&t, xd); /* t = xd^2 */
     secp256k1_fe_sqr(&t, &t); /* t = xd^4 */
     VERIFY_CHECK(SECP256K1_B <= 31);
     secp256k1_fe_mul_int(&t, SECP256K1_B); /* t = 7*xd^4 */
     secp256k1_fe_add(&r, &t); /* r = xd*xn^3 + 7*xd^4 */
     return secp256k1_fe_is_square_var(&r);
}